

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> *
BytesToBits(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
           vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  _Bit_type *p_Var1;
  pointer puVar2;
  difference_type __n;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  _Bit_type _Var7;
  long in_FS_OFFSET;
  allocator_type local_1a;
  bool local_19;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,
             ((long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start) * 8,&local_19,&local_1a);
  p_Var1 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar4 = ((long)(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) *
          8 + (ulong)(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (uVar4 != 0) {
    puVar2 = (bytes->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    do {
      uVar6 = 1L << ((byte)uVar3 & 0x3f);
      uVar5 = uVar3 >> 6;
      if ((puVar2[uVar3 >> 3 & 0x1fffffff] >> ((uint)uVar3 & 7) & 1) == 0) {
        _Var7 = ~uVar6 & p_Var1[uVar5];
      }
      else {
        _Var7 = uVar6 | p_Var1[uVar5];
      }
      p_Var1[uVar5] = _Var7;
      uVar3 = uVar3 + 1;
    } while ((uVar3 & 0xffffffff) < uVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<bool> BytesToBits(const std::vector<unsigned char>& bytes)
{
    std::vector<bool> ret(bytes.size() * 8);
    for (unsigned int p = 0; p < ret.size(); p++) {
        ret[p] = (bytes[p / 8] & (1 << (p % 8))) != 0;
    }
    return ret;
}